

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

char * __thiscall doctest::String::allocate(String *this,uint sz)

{
  char *pcVar1;
  uint in_ESI;
  String *in_RDI;
  String *local_8;
  
  if (in_ESI < 0x18) {
    (in_RDI->field_0).buf[in_ESI] = '\0';
    setLast(in_RDI,0x17 - in_ESI);
    local_8 = in_RDI;
  }
  else {
    setOnHeap(in_RDI);
    (in_RDI->field_0).data.size = in_ESI;
    (in_RDI->field_0).data.capacity = (in_RDI->field_0).data.size + 1;
    pcVar1 = (char *)operator_new__((ulong)(in_RDI->field_0).data.capacity);
    (in_RDI->field_0).data.ptr = pcVar1;
    (in_RDI->field_0).data.ptr[in_ESI] = '\0';
    local_8 = (String *)(in_RDI->field_0).data.ptr;
  }
  return (char *)local_8;
}

Assistant:

char* String::allocate(unsigned sz) {
    if (sz <= last) {
        buf[sz] = '\0';
        setLast(last - sz);
        return buf;
    } else {
        setOnHeap();
        data.size = sz;
        data.capacity = data.size + 1;
        data.ptr = new char[data.capacity];
        data.ptr[sz] = '\0';
        return data.ptr;
    }
}